

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O3

void parse_label(LexState *ls)

{
  uint8_t *puVar1;
  FuncState *pFVar2;
  MSize idx;
  uint uVar3;
  GCstr *name;
  VarInfo *pVVar4;
  FuncScope *pFVar5;
  
  pFVar2 = ls->fs;
  pFVar2->lasttarget = pFVar2->pc;
  puVar1 = &pFVar2->bl->flags;
  *puVar1 = *puVar1 | 4;
  lj_lex_next(ls);
  name = lex_str(ls);
  pVVar4 = gola_findlabel(ls,name);
  if (pVVar4 != (VarInfo *)0x0) {
    lj_lex_error(ls,0,LJ_ERR_XLDUP,name + 1);
  }
  idx = gola_new(ls,name,'\x04',pFVar2->pc);
  lex_check(ls,0x11d);
  while( true ) {
    if (ls->tok != 0x11d) {
      uVar3 = ls->tok - 0x104;
      if ((uVar3 < 0x1e) && ((0x20000007U >> (uVar3 & 0x1f) & 1) != 0)) {
        pFVar5 = pFVar2->bl;
        ls->vstack[idx].slot = pFVar5->nactvar;
      }
      else {
        pFVar5 = pFVar2->bl;
      }
      gola_resolve(ls,(FuncScope *)(ulong)pFVar5->vstart,idx);
      return;
    }
    uVar3 = ls->level + 1;
    ls->level = uVar3;
    if (199 < uVar3) break;
    parse_label(ls);
    ls->level = ls->level - 1;
  }
  lj_lex_error(ls,0,LJ_ERR_XLEVELS);
}

Assistant:

static void parse_label(LexState *ls)
{
  FuncState *fs = ls->fs;
  GCstr *name;
  MSize idx;
  fs->lasttarget = fs->pc;
  fs->bl->flags |= FSCOPE_GOLA;
  lj_lex_next(ls);  /* Skip '::'. */
  name = lex_str(ls);
  if (gola_findlabel(ls, name))
    lj_lex_error(ls, 0, LJ_ERR_XLDUP, strdata(name));
  idx = gola_new(ls, name, VSTACK_LABEL, fs->pc);
  lex_check(ls, TK_label);
  /* Recursively parse trailing statements: labels and ';' (Lua 5.2 only). */
  for (;;) {
    if (ls->tok == TK_label) {
      synlevel_begin(ls);
      parse_label(ls);
      synlevel_end(ls);
    } else if (LJ_52 && ls->tok == ';') {
      lj_lex_next(ls);
    } else {
      break;
    }
  }
  /* Trailing label is considered to be outside of scope. */
  if (parse_isend(ls->tok) && ls->tok != TK_until)
    ls->vstack[idx].slot = fs->bl->nactvar;
  gola_resolve(ls, fs->bl, idx);
}